

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O0

int POSIX::multithreading::Pthread_create
              (pthread_t *thread,pthread_attr_t *attr,_func_void_ptr_void_ptr *start_routine,
              void *arg)

{
  int iVar1;
  allocator local_49;
  string local_48 [32];
  void *local_28;
  void *arg_local;
  _func_void_ptr_void_ptr *start_routine_local;
  pthread_attr_t *attr_local;
  pthread_t *thread_local;
  
  local_28 = arg;
  arg_local = start_routine;
  start_routine_local = (_func_void_ptr_void_ptr *)attr;
  attr_local = (pthread_attr_t *)thread;
  iVar1 = pthread_create(thread,(pthread_attr_t *)attr,(__start_routine *)start_routine,arg);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"pthrad_create error",&local_49);
  iVar1 = check_error(iVar1,(string *)local_48,0);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return iVar1;
}

Assistant:

int Pthread_create(pthread_t *thread, const pthread_attr_t *attr, void *(*start_routine) (void *), void *arg) {
            return check_error(pthread_create(thread, attr, start_routine, arg), "pthrad_create error");
        }